

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cpp
# Opt level: O1

int rs_read_object_reference
              (FILE *inf,list<ItemThing_*,_std::allocator<ItemThing_*>_> *list,ItemThing **item)

{
  int in_EAX;
  _List_node_base *p_Var1;
  _List_node_base *extraout_RDX;
  _List_node_base *p_Var2;
  int i;
  int local_c;
  
  if ((read_error == '\0') && ((format_error & 1) == 0)) {
    rs_read_int(inf,&local_c);
    in_EAX = 0x174a70;
    if (player.pack.super__List_base<ItemThing_*,_std::allocator<ItemThing_*>_>._M_impl._M_node.
        super__List_node_base._M_next != (_List_node_base *)&player.pack) {
      local_c = -local_c;
      p_Var1 = player.pack.super__List_base<ItemThing_*,_std::allocator<ItemThing_*>_>._M_impl.
               _M_node.super__List_node_base._M_next;
      p_Var2 = extraout_RDX;
      do {
        if (local_c == 0) {
          p_Var2 = p_Var1[1]._M_next;
        }
        local_c = local_c + 1;
        if (local_c == 1) goto LAB_001236f7;
        p_Var1 = p_Var1->_M_next;
      } while (p_Var1 != (_List_node_base *)&player.pack);
    }
    p_Var2 = (_List_node_base *)0x0;
LAB_001236f7:
    (list->super__List_base<ItemThing_*,_std::allocator<ItemThing_*>_>)._M_impl._M_node.
    super__List_node_base._M_next = p_Var2;
  }
  return in_EAX;
}

Assistant:

static int rs_read_object_reference(FILE *inf, std::list<ItemThing*>& list, ItemThing **item)
{
    int i;
    
    if (read_error || format_error)
        return(READSTAT);

    rs_read_int(inf, &i);

    *item = get_list_item(list, i);
            
    return(READSTAT);
}